

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

int jsmn_parse(jsmn_parser *parser,char *js,size_t len,jsmntok_t *tokens,size_t num_tokens)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  jsmntok_t *pjVar7;
  long lVar8;
  long lVar9;
  int *piVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  jsmntype_t jVar15;
  uint uVar17;
  ulong unaff_R13;
  ulong uVar16;
  
  uVar12 = parser->toknext;
  if (parser->pos < len) {
    uVar11 = (ulong)parser->pos;
    do {
      uVar5 = (uint)uVar11;
      bVar1 = js[uVar11];
      uVar6 = 0xfffffffe;
      bVar3 = false;
      if (bVar1 < 0x20) {
        if ((bVar1 - 9 < 2) || (bVar1 == 0xd)) goto switchD_0016c1fb_caseD_20;
        bVar3 = false;
        if (bVar1 != 0) goto switchD_0016c1fb_caseD_21;
        break;
      }
      switch(bVar1) {
      case 0x20:
        break;
      case 0x21:
      case 0x23:
      case 0x24:
      case 0x25:
      case 0x26:
      case 0x27:
      case 0x28:
      case 0x29:
      case 0x2a:
      case 0x2b:
      case 0x2e:
      case 0x2f:
        goto switchD_0016c1fb_caseD_21;
      case 0x22:
        uVar14 = uVar5 + 1;
        parser->pos = uVar14;
        uVar6 = (ulong)uVar14;
        uVar11 = uVar6;
        while (uVar11 < len) {
          cVar2 = js[uVar11];
          uVar17 = (uint)uVar11;
          if (cVar2 == '\"') {
            if (tokens != (jsmntok_t *)0x0) {
              uVar13 = parser->toknext;
              if (uVar13 < num_tokens) {
                parser->toknext = uVar13 + 1;
                pjVar7 = tokens + uVar13;
                pjVar7->start = -1;
                pjVar7->end = -1;
                pjVar7->size = 0;
                pjVar7->parent = -1;
              }
              else {
                pjVar7 = (jsmntok_t *)0x0;
              }
              if (pjVar7 == (jsmntok_t *)0x0) {
                parser->pos = uVar5;
                uVar6 = 0xffffffff;
LAB_0016c341:
                bVar3 = false;
                uVar17 = uVar5;
                goto LAB_0016c371;
              }
              pjVar7->type = JSMN_STRING;
              pjVar7->start = uVar14;
              pjVar7->end = uVar17;
              pjVar7->size = 0;
              pjVar7->parent = parser->toksuper;
            }
            uVar6 = 0;
            bVar3 = false;
          }
          else {
            bVar3 = true;
            if (cVar2 == '\\') {
              uVar13 = uVar17 + 1;
              if (uVar13 < len) {
                parser->pos = uVar13;
                bVar1 = js[uVar13];
                if ((bVar1 - 0x2f < 0x38) &&
                   ((0x88200000000001U >> ((ulong)(bVar1 - 0x2f) & 0x3f) & 1) != 0)) {
switchD_0016c282_caseD_6e:
                  uVar17 = uVar13;
                }
                else {
                  switch(bVar1) {
                  case 0x6e:
                  case 0x72:
                  case 0x74:
                    goto switchD_0016c282_caseD_6e;
                  case 0x6f:
                  case 0x70:
                  case 0x71:
                  case 0x73:
switchD_0016c282_caseD_6f:
                    parser->pos = uVar5;
                    uVar6 = 0xfffffffe;
                    goto LAB_0016c341;
                  case 0x75:
                    uVar17 = uVar17 + 2;
                    parser->pos = uVar17;
                    iVar4 = 4;
                    do {
                      if ((len <= uVar17) || (bVar1 = js[uVar17], bVar1 == 0)) break;
                      if ((9 < (byte)(bVar1 - 0x30)) &&
                         ((0x25 < bVar1 - 0x41 ||
                          ((0x3f0000003fU >> ((ulong)(bVar1 - 0x41) & 0x3f) & 1) == 0))))
                      goto switchD_0016c282_caseD_6f;
                      uVar17 = uVar17 + 1;
                      parser->pos = uVar17;
                      iVar4 = iVar4 + -1;
                    } while (iVar4 != 0);
                    uVar17 = uVar17 - 1;
                    parser->pos = uVar17;
                    break;
                  default:
                    uVar17 = uVar13;
                    if (bVar1 != 0x22) goto switchD_0016c282_caseD_6f;
                  }
                }
              }
            }
            else if (cVar2 == '\0') break;
          }
LAB_0016c371:
          if (!bVar3) goto LAB_0016c637;
          parser->pos = uVar17 + 1;
          uVar11 = (ulong)(uVar17 + 1);
        }
        parser->pos = uVar5;
        uVar6 = 0xfffffffd;
        uVar17 = uVar5;
LAB_0016c637:
        uVar5 = uVar17;
        if ((int)uVar6 < 0) goto LAB_0016c58f;
LAB_0016c63f:
        uVar12 = uVar12 + 1;
        if ((long)parser->toksuper != -1 && tokens != (jsmntok_t *)0x0) {
          tokens[parser->toksuper].size = tokens[parser->toksuper].size + 1;
        }
        break;
      case 0x2c:
        if (((tokens != (jsmntok_t *)0x0) && (lVar8 = (long)parser->toksuper, lVar8 != -1)) &&
           (1 < tokens[lVar8].type - JSMN_OBJECT)) {
          iVar4 = tokens[lVar8].parent;
          goto LAB_0016c60c;
        }
        break;
      case 0x2d:
      case 0x30:
      case 0x31:
      case 0x32:
      case 0x33:
      case 0x34:
      case 0x35:
      case 0x36:
      case 0x37:
      case 0x38:
      case 0x39:
switchD_0016c1fb_caseD_2d:
        if ((tokens == (jsmntok_t *)0x0) || (lVar8 = (long)parser->toksuper, lVar8 == -1)) {
LAB_0016c49a:
          do {
            bVar1 = js[uVar11];
            uVar16 = (ulong)bVar1;
            uVar6 = 0xfffffffd;
            bVar3 = true;
            iVar4 = (int)uVar11;
            if (uVar16 < 0x2d) {
              if ((0x100100002600U >> (uVar16 & 0x3f) & 1) == 0) {
                if (uVar16 != 0) goto LAB_0016c4c6;
                break;
              }
LAB_0016c4f3:
              if (tokens != (jsmntok_t *)0x0) {
                uVar14 = parser->toknext;
                if (uVar14 < num_tokens) {
                  parser->toknext = uVar14 + 1;
                  pjVar7 = tokens + uVar14;
                  pjVar7->start = -1;
                  pjVar7->end = -1;
                  pjVar7->size = 0;
                  pjVar7->parent = -1;
                }
                else {
                  pjVar7 = (jsmntok_t *)0x0;
                }
                if (pjVar7 == (jsmntok_t *)0x0) {
                  uVar6 = 0xffffffff;
                  break;
                }
                pjVar7->type = JSMN_PRIMITIVE;
                pjVar7->start = uVar5;
                pjVar7->end = iVar4;
                pjVar7->size = 0;
                pjVar7->parent = parser->toksuper;
              }
              uVar5 = iVar4 - 1;
              bVar3 = false;
              uVar6 = 0;
              break;
            }
LAB_0016c4c6:
            if ((bVar1 == 0x5d) || (bVar1 == 0x7d)) goto LAB_0016c4f3;
            if ((byte)(bVar1 + 0x81) < 0xa1) {
              uVar6 = 0xfffffffe;
              break;
            }
            uVar11 = (ulong)(iVar4 + 1U);
            parser->pos = iVar4 + 1U;
          } while (uVar11 < len);
          parser->pos = uVar5;
          if (bVar3) goto LAB_0016c58f;
          goto LAB_0016c63f;
        }
        if ((tokens[lVar8].type == JSMN_OBJECT) ||
           ((tokens[lVar8].type == JSMN_STRING && (tokens[lVar8].size != 0)))) {
          bVar3 = false;
          unaff_R13 = 0xfffffffe;
        }
        else {
          bVar3 = true;
        }
        if (bVar3) goto LAB_0016c49a;
        bVar3 = false;
        goto LAB_0016c1c6;
      case 0x3a:
switchD_0016c1fb_caseD_3a:
        iVar4 = parser->toknext - 1;
LAB_0016c60c:
        parser->toksuper = iVar4;
        break;
      default:
        uVar14 = bVar1 - 0x5b;
        uVar16 = (ulong)uVar14;
        if (uVar14 < 0x23) {
          if ((0x2080800UL >> (uVar16 & 0x3f) & 1) != 0) goto switchD_0016c1fb_caseD_2d;
          if ((0x100000001U >> (uVar16 & 0x3f) & 1) != 0) {
            uVar12 = uVar12 + 1;
            if (tokens != (jsmntok_t *)0x0) {
              uVar14 = parser->toknext;
              if (uVar14 < num_tokens) {
                parser->toknext = uVar14 + 1;
                pjVar7 = tokens + uVar14;
                pjVar7->start = -1;
                pjVar7->end = -1;
                pjVar7->size = 0;
                pjVar7->parent = -1;
              }
              else {
                pjVar7 = (jsmntok_t *)0x0;
              }
              if (pjVar7 != (jsmntok_t *)0x0) {
                iVar4 = parser->toksuper;
                if ((long)iVar4 != -1) {
                  tokens[iVar4].size = tokens[iVar4].size + 1;
                  pjVar7->parent = iVar4;
                }
                pjVar7->type = (bVar1 != 0x7b) + JSMN_OBJECT;
                pjVar7->start = uVar5;
                goto switchD_0016c1fb_caseD_3a;
              }
              uVar6 = 0xffffffff;
              goto LAB_0016c58f;
            }
            break;
          }
          if ((0x400000004U >> (uVar16 & 0x3f) & 1) == 0) goto switchD_0016c1fb_caseD_21;
          if (tokens == (jsmntok_t *)0x0) break;
          if (parser->toknext != 0) {
            jVar15 = (bVar1 != 0x7d) + JSMN_OBJECT;
            uVar11 = (ulong)(parser->toknext - 1);
            do {
              pjVar7 = tokens + uVar11;
              if ((pjVar7->start != -1) && (pjVar7->end == -1)) {
                if (pjVar7->type != jVar15) goto LAB_0016c58f;
                pjVar7->end = uVar5 + 1;
                iVar4 = pjVar7->parent;
                goto LAB_0016c60c;
              }
              uVar11 = (ulong)pjVar7->parent;
            } while (uVar11 != 0xffffffffffffffff);
            if ((pjVar7->type == jVar15) && (parser->toksuper != -1)) break;
          }
LAB_0016c58f:
          bVar3 = false;
        }
        goto switchD_0016c1fb_caseD_21;
      }
switchD_0016c1fb_caseD_20:
      bVar3 = true;
LAB_0016c1c6:
      uVar6 = unaff_R13 & 0xffffffff;
switchD_0016c1fb_caseD_21:
      if (!bVar3) {
        return (int)uVar6;
      }
      uVar11 = (ulong)(uVar5 + 1);
      parser->pos = uVar5 + 1;
      unaff_R13 = uVar6;
    } while (uVar11 < len);
  }
  if ((tokens != (jsmntok_t *)0x0) && (uVar5 = parser->toknext - 1, -1 < (int)uVar5)) {
    piVar10 = &tokens[uVar5].end;
    lVar8 = (ulong)uVar5 + 1;
    do {
      if ((piVar10[-1] != -1) && (*piVar10 == -1)) {
        return -3;
      }
      piVar10 = piVar10 + -5;
      lVar9 = lVar8 + -1;
      bVar3 = 0 < lVar8;
      lVar8 = lVar9;
    } while (lVar9 != 0 && bVar3);
  }
  return uVar12;
}

Assistant:

static int jsmn_parse(jsmn_parser *parser, const char *js, size_t len,
                      jsmntok_t *tokens, size_t num_tokens) {
    int r;
    int i;
    jsmntok_t *token;
    int count = parser->toknext;

    for (; parser->pos < len && js[parser->pos] != '\0'; parser->pos++) {
        char c;
        jsmntype_t type;

        c = js[parser->pos];
        switch (c) {
            case '{': case '[':
                count++;
                if (tokens == NULL) {
                    break;
                }
                token = jsmn_alloc_token(parser, tokens, num_tokens);
                if (token == NULL)
                    return JSMN_ERROR_NOMEM;
                if (parser->toksuper != -1) {
                    tokens[parser->toksuper].size++;
#ifdef JSMN_PARENT_LINKS
                    token->parent = parser->toksuper;
#endif
                }
                token->type = (c == '{' ? JSMN_OBJECT : JSMN_ARRAY);
                token->start = parser->pos;
                parser->toksuper = parser->toknext - 1;
                break;
            case '}': case ']':
                if (tokens == NULL)
                    break;
                type = (c == '}' ? JSMN_OBJECT : JSMN_ARRAY);
#ifdef JSMN_PARENT_LINKS
                if (parser->toknext < 1) {
                    return JSMN_ERROR_INVAL;
                }
                token = &tokens[parser->toknext - 1];
                for (;;) {
                    if (token->start != -1 && token->end == -1) {
                        if (token->type != type) {
                            return JSMN_ERROR_INVAL;
                        }
                        token->end = parser->pos + 1;
                        parser->toksuper = token->parent;
                        break;
                    }
                    if (token->parent == -1) {
                        if(token->type != type || parser->toksuper == -1) {
                            return JSMN_ERROR_INVAL;
                        }
                        break;
                    }
                    token = &tokens[token->parent];
                }
#else
                for (i = parser->toknext - 1; i >= 0; i--) {
				token = &tokens[i];
				if (token->start != -1 && token->end == -1) {
					if (token->type != type) {
						return JSMN_ERROR_INVAL;
					}
					parser->toksuper = -1;
					token->end = parser->pos + 1;
					break;
				}
			}
			/* Error if unmatched closing bracket */
			if (i == -1) return JSMN_ERROR_INVAL;
			for (; i >= 0; i--) {
				token = &tokens[i];
				if (token->start != -1 && token->end == -1) {
					parser->toksuper = i;
					break;
				}
			}
#endif
                break;
            case '\"':
                r = jsmn_parse_string(parser, js, len, tokens, num_tokens);
                if (r < 0) return r;
                count++;
                if (parser->toksuper != -1 && tokens != NULL)
                    tokens[parser->toksuper].size++;
                break;
            case '\t' : case '\r' : case '\n' : case ' ':
                break;
            case ':':
                parser->toksuper = parser->toknext - 1;
                break;
            case ',':
                if (tokens != NULL && parser->toksuper != -1 &&
                    tokens[parser->toksuper].type != JSMN_ARRAY &&
                    tokens[parser->toksuper].type != JSMN_OBJECT) {
#ifdef JSMN_PARENT_LINKS
                    parser->toksuper = tokens[parser->toksuper].parent;
#else
                    for (i = parser->toknext - 1; i >= 0; i--) {
					if (tokens[i].type == JSMN_ARRAY || tokens[i].type == JSMN_OBJECT) {
						if (tokens[i].start != -1 && tokens[i].end == -1) {
							parser->toksuper = i;
							break;
						}
					}
				}
#endif
                }
                break;
#ifdef JSMN_STRICT
                /* In strict mode primitives are: numbers and booleans */
            case '-': case '0': case '1' : case '2': case '3' : case '4':
            case '5': case '6': case '7' : case '8': case '9':
            case 't': case 'f': case 'n' :
                /* And they must not be keys of the object */
                if (tokens != NULL && parser->toksuper != -1) {
                    jsmntok_t *t = &tokens[parser->toksuper];
                    if (t->type == JSMN_OBJECT ||
                        (t->type == JSMN_STRING && t->size != 0)) {
                        return JSMN_ERROR_INVAL;
                    }
                }
#else
                /* In non-strict mode every unquoted value is a primitive */
		default:
#endif
                r = jsmn_parse_primitive(parser, js, len, tokens, num_tokens);
                if (r < 0) return r;
                count++;
                if (parser->toksuper != -1 && tokens != NULL)
                    tokens[parser->toksuper].size++;
                break;

#ifdef JSMN_STRICT
                /* Unexpected char in strict mode */
            default:
                return JSMN_ERROR_INVAL;
#endif
        }
    }

    if (tokens != NULL) {
        for (i = parser->toknext - 1; i >= 0; i--) {
            /* Unmatched opened object or array */
            if (tokens[i].start != -1 && tokens[i].end == -1) {
                return JSMN_ERROR_PART;
            }
        }
    }

    return count;
}